

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall glslang::HlslParseContext::fixTextureShadowModes(HlslParseContext *this)

{
  _Base_ptr p_Var1;
  int iVar2;
  key_type_conflict2 in_RAX;
  undefined4 extraout_var;
  uint *puVar3;
  undefined4 extraout_var_00;
  iterator iVar4;
  undefined4 extraout_var_01;
  pointer ppTVar5;
  key_type_conflict2 local_38;
  
  local_38 = in_RAX;
  for (ppTVar5 = (this->super_TParseContextBase).linkageSymbols.
                 super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                 super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar5 !=
      (this->super_TParseContextBase).linkageSymbols.
      super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
      super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar5 = ppTVar5 + 1) {
    iVar2 = (*(*ppTVar5)->_vptr_TSymbol[0xd])();
    puVar3 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))
                               ((long *)CONCAT44(extraout_var,iVar2));
    if ((*puVar3 & 0x280000) == 0) {
      iVar2 = (*(*ppTVar5)->_vptr_TSymbol[0xf])();
      local_38 = CONCAT44(extraout_var_00,iVar2);
      iVar4 = std::
              _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
              ::find((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                      *)&this->textureShadowVariant,&local_38);
      if ((_Rb_tree_header *)iVar4._M_node !=
          &(this->textureShadowVariant).
           super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header) {
        p_Var1 = iVar4._M_node[1]._M_parent;
        if ((*(long *)p_Var1 != -1) && (p_Var1->_M_parent != (_Base_ptr)0xffffffffffffffff)) {
          ((this->super_TParseContextBase).super_TParseVersions.intermediate)->needToLegalize = true
          ;
        }
        iVar2 = (*(*ppTVar5)->_vptr_TSymbol[0xf])();
        *puVar3 = *puVar3 & 0xfffdffff |
                  (uint)(p_Var1->_M_parent == (_Base_ptr)CONCAT44(extraout_var_01,iVar2)) << 0x11;
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::fixTextureShadowModes()
{
    for (auto symbol = linkageSymbols.begin(); symbol != linkageSymbols.end(); ++symbol) {
        TSampler& sampler = (*symbol)->getWritableType().getSampler();

        if (sampler.isTexture()) {
            const auto shadowMode = textureShadowVariant.find((*symbol)->getUniqueId());
            if (shadowMode != textureShadowVariant.end()) {

                if (shadowMode->second->overloaded())
                    // Texture needs legalization if it's been seen with both shadow and non-shadow modes.
                    intermediate.setNeedsLegalization();

                sampler.shadow = shadowMode->second->isShadowId((*symbol)->getUniqueId());
            }
        }
    }
}